

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InvariantOuterEdgeCase::iterate
          (InvariantOuterEdgeCase *this)

{
  ostringstream *poVar1;
  _anonymous_namespace_ *this_00;
  pointer *ppfVar2;
  TestLog *pTVar3;
  RenderContext *pRVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  long lVar11;
  MessageBuilder *this_01;
  long lVar12;
  long lVar13;
  deUint32 tfPrimTypeGL;
  _anonymous_namespace_ *outer;
  long lVar14;
  int constantOuterLevelIndex;
  undefined8 extraout_RDX;
  undefined8 uVar15;
  undefined8 extraout_RDX_00;
  int iVar16;
  pointer pPVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  float *outerLevels;
  float *pfVar22;
  int vtxNdx;
  long lVar23;
  Vec3 *v;
  float fVar24;
  int local_6ec;
  int local_6e0;
  vector<float,_std::allocator<float>_> patchTessLevels_1;
  Vec3Set outerEdgeVertices;
  RandomViewport viewport;
  Result tfResult;
  Vec3Set firstOuterEdgeVertices;
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  edgeDescriptions;
  string local_5b8;
  string local_598;
  string local_578;
  vector<float,_std::allocator<float>_> patchTessLevels;
  TFHandler tfHandler;
  VertexArrayBinding bindings [1];
  MessageBuilder local_330;
  MessageBuilder local_1b0;
  undefined4 extraout_var_00;
  
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar7 = (*pRVar4->_vptr_RenderContext[4])(pRVar4);
  dVar8 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar21 = (ulong)dVar8;
  gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var,iVar7),0x10,0x10,dVar8);
  iVar7 = (*pRVar4->_vptr_RenderContext[3])(pRVar4);
  lVar11 = CONCAT44(extraout_var_00,iVar7);
  outerEdgeDescriptions(&edgeDescriptions,this->m_primitiveType);
  fVar24 = arrayMax<float,12>(&iterate::singleOuterEdgeLevels);
  generatePatchTessLevels(&patchTessLevels,0,constantOuterLevelIndex,fVar24);
  iVar7 = 0;
  iVar10 = 2;
  while (iVar16 = iVar10 + -1, iVar10 != 0) {
    iVar9 = multiplePatchReferenceVertexCount
                      (this->m_primitiveType,this->m_spacing,iVar10 != 2,
                       patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,(int)uVar21);
    iVar10 = iVar16;
    if (iVar7 <= iVar9) {
      iVar7 = iVar9;
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&patchTessLevels.super__Vector_base<float,_std::allocator<float>_>);
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            (&tfHandler,((this->super_TestCase).m_context)->m_renderCtx,iVar7);
  (**(code **)(lVar11 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  (**(code **)(lVar11 + 0xfd8))(0x8e72);
  lVar20 = 0;
  uVar15 = extraout_RDX;
  do {
    if ((int)((ulong)((long)edgeDescriptions.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)edgeDescriptions.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) <= lVar20) {
      TransformFeedbackHandler<tcu::Vector<float,_3>_>::~TransformFeedbackHandler(&tfHandler);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
LAB_00416f96:
      std::
      _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
      ::~_Vector_base(&edgeDescriptions.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                     );
      return STOP;
    }
    lVar14 = 0;
    while (lVar14 != 0xc) {
      fVar24 = iterate::singleOuterEdgeLevels[lVar14];
      generatePatchTessLevels(&patchTessLevels_1,(int)lVar20,(int)uVar15,fVar24);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&patchTessLevels,"in_v_attr",(allocator<char> *)&local_330);
      glu::va::Float(bindings,(string *)&patchTessLevels,1,
                     (int)((ulong)((long)patchTessLevels_1.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)patchTessLevels_1.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2),0,
                     patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start);
      std::__cxx11::string::~string((string *)&patchTessLevels);
      firstOuterEdgeVertices._M_t._M_impl._0_1_ = 0;
      firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
      ;
      firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header;
      firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      ppfVar2 = &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppfVar2);
      std::operator<<((ostream *)ppfVar2,"Testing with outer tessellation level ");
      this_01 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&patchTessLevels,
                           iterate::singleOuterEdgeLevels + lVar14);
      poVar1 = &this_01->m_str;
      std::operator<<((ostream *)poVar1," for the ");
      (anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                ((string *)&local_330,
                 edgeDescriptions.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar20);
      std::operator<<((ostream *)poVar1,(string *)&local_330);
      std::operator<<((ostream *)poVar1,
                      " edge, and with various levels for other edges, and with all programs");
      tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)
                 &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      lVar19 = 0;
      while( true ) {
        pPVar17 = (this->m_programs).
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar12 = (long)(this->m_programs).
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar17;
        lVar13 = (long)(int)(lVar12 / 0x18);
        if (lVar13 <= lVar19) break;
        dVar8 = ((pPVar17[lVar19].program.m_ptr)->m_program).m_program;
        (**(code **)(lVar11 + 0x1680))(dVar8,lVar19,lVar12 % 0x18);
        pPVar17 = pPVar17 + lVar19;
        tfPrimTypeGL = 0;
        if (pPVar17->usePointMode == false) {
          tfPrimTypeGL = 0xffffffff;
          if ((ulong)this->m_primitiveType < 3) {
            tfPrimTypeGL = *(deUint32 *)(&DAT_007fdc40 + (ulong)this->m_primitiveType * 4);
          }
        }
        iVar7 = 1;
        TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
                  (&tfResult,&tfHandler,dVar8,tfPrimTypeGL,1,bindings,
                   (int)((ulong)((long)patchTessLevels_1.
                                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)patchTessLevels_1.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2));
        iVar10 = multiplePatchReferenceVertexCount
                           (this->m_primitiveType,this->m_spacing,pPVar17->usePointMode,
                            patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start,iVar7);
        if (iVar10 != (int)(((long)tfResult.varying.
                                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)tfResult.varying.
                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0xc)) {
          poVar1 = &local_330.m_str;
          local_330.m_log = pTVar3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
          std::operator<<((ostream *)poVar1,
                          "Failure: the number of vertices returned by transform feedback is ");
          iVar16 = 0xc;
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::operator<<((ostream *)&local_330.m_str,", expected ");
          std::ostream::operator<<(&local_330.m_str,iVar10);
          patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)tcu::MessageBuilder::operator<<
                                  (&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream
                    ((ostringstream *)
                     &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish);
          ppfVar2 = &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          std::operator<<((ostream *)ppfVar2,"Note: rendered ");
          std::ostream::operator<<(ppfVar2,10);
          std::operator<<((ostream *)ppfVar2,
                          " patches in one draw call; tessellation levels for each patch are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
                         );
          containerStr<std::vector<float,std::allocator<float>>>
                    ((string *)&local_1b0,(Functional *)&patchTessLevels_1,
                     (vector<float,_std::allocator<float>_> *)0x6,iVar16,iVar7);
          std::operator<<((ostream *)
                          &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish,(string *)&local_1b0);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&patchTessLevels,(EndMessageToken *)&tcu::TestLog::EndMessage
                    );
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::ostringstream::~ostringstream
                    ((ostringstream *)
                     &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330.m_str);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Invalid set of vertices");
LAB_00416f20:
          std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
          ~_Vector_base(&tfResult.varying.
                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       );
          break;
        }
        lVar12 = 0;
        local_6ec = 0;
        while (lVar12 != 10) {
          this_00 = (_anonymous_namespace_ *)
                    (patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar12 * 6);
          outerLevels = patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar12 * 6 + 2;
          outer = this_00;
          pfVar22 = outerLevels;
          iVar7 = referenceVertexCount
                            (this->m_primitiveType,this->m_spacing,pPVar17->usePointMode,
                             (float *)this_00,outerLevels);
          outerEdgeVertices._M_t._M_impl._0_1_ = 0;
          outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header;
          outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          iVar7 = iVar7 + local_6ec;
          lVar23 = (long)local_6ec;
          lVar18 = lVar23 * 0xc;
          outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          for (; iVar10 = (int)pfVar22, lVar23 < iVar7; lVar23 = lVar23 + 1) {
            v = (Vec3 *)((long)(tfResult.varying.
                                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18);
            bVar5 = OuterEdgeDescription::contains
                              (edgeDescriptions.
                               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar20,v);
            if (bVar5) {
              std::
              set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
              ::insert(&outerEdgeVertices,v);
            }
            lVar18 = lVar18 + 0xc;
          }
          iVar16 = getClampedRoundedTessLevel(this->m_spacing,fVar24);
          if (iVar16 + 1 == (int)outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count)
          {
            local_6e0 = (int)lVar19;
            if ((int)lVar12 == 0 && local_6e0 == 0) {
              bVar5 = true;
              std::
              set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
              ::operator=(&firstOuterEdgeVertices,&outerEdgeVertices);
            }
            else {
              bVar6 = std::operator!=(&firstOuterEdgeVertices,&outerEdgeVertices);
              bVar5 = true;
              if (bVar6) {
                ppfVar2 = &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)pTVar3;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)ppfVar2);
                std::operator<<((ostream *)ppfVar2,
                                "Failure: vertices generated for the edge differ between the following cases:\n"
                               );
                std::operator<<((ostream *)ppfVar2,"  - case A: ");
                (anonymous_namespace)::InvariantOuterEdgeCase::Program::description_abi_cxx11_
                          ((string *)&local_330,
                           (this->m_programs).
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                std::operator<<((ostream *)ppfVar2,(string *)&local_330);
                std::operator<<((ostream *)ppfVar2,", tessellation levels: ");
                (anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                          ((string *)&local_1b0,
                           (_anonymous_namespace_ *)
                           patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                           patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start + 2,(float *)outer);
                std::operator<<((ostream *)ppfVar2,(string *)&local_1b0);
                std::operator<<((ostream *)ppfVar2,"\n");
                std::operator<<((ostream *)ppfVar2,"  - case B: ");
                (anonymous_namespace)::InvariantOuterEdgeCase::Program::description_abi_cxx11_
                          (&local_598,pPVar17);
                std::operator<<((ostream *)ppfVar2,(string *)&local_598);
                std::operator<<((ostream *)ppfVar2,", tessellation levels: ");
                (anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                          (&local_5b8,this_00,outerLevels,(float *)outer);
                iVar7 = (int)outer;
                std::operator<<((ostream *)ppfVar2,(string *)&local_5b8);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&patchTessLevels,
                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::string::~string((string *)&local_5b8);
                std::__cxx11::string::~string((string *)&local_598);
                std::__cxx11::string::~string((string *)&local_1b0);
                std::__cxx11::string::~string((string *)&local_330);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppfVar2);
                ppfVar2 = &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)pTVar3;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)ppfVar2);
                std::operator<<((ostream *)ppfVar2,
                                "Note: resulting vertices for the edge for the cases were:\n");
                std::operator<<((ostream *)ppfVar2,"  - case A: ");
                containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                          ((string *)&local_330,(Functional *)&firstOuterEdgeVertices,
                           (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            *)0xe,iVar7,iVar10);
                std::operator<<((ostream *)ppfVar2,(string *)&local_330);
                std::operator<<((ostream *)ppfVar2,"\n");
                std::operator<<((ostream *)ppfVar2,"  - case B: ");
                containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                          ((string *)&local_1b0,(Functional *)&outerEdgeVertices,
                           (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            *)0xe,iVar7,iVar10);
                std::operator<<((ostream *)ppfVar2,(string *)&local_1b0);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&patchTessLevels,
                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::string::~string((string *)&local_1b0);
                std::__cxx11::string::~string((string *)&local_330);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppfVar2);
                tcu::TestContext::setTestResult
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                           QP_TEST_RESULT_FAIL,"Invalid set of vertices");
                goto LAB_00416d77;
              }
            }
          }
          else {
            poVar1 = &local_1b0.m_str;
            local_1b0.m_log = pTVar3;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
            ppfVar2 = &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            std::operator<<((ostream *)poVar1,"Failure: the number of vertices on outer edge is ");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::operator<<((ostream *)poVar1,", expected ");
            std::ostream::operator<<(poVar1,iVar16 + 1);
            local_330.m_log =
                 tcu::MessageBuilder::operator<<
                           (&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330.m_str);
            std::operator<<((ostream *)&local_330.m_str,"Note: vertices on the outer edge are:\n");
            containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                      (&local_598,(Functional *)&outerEdgeVertices,
                       (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        *)0x0,(int)outer,iVar10);
            std::operator<<((ostream *)&local_330.m_str,(string *)&local_598);
            patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)tcu::MessageBuilder::operator<<
                                    (&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)ppfVar2);
            std::operator<<((ostream *)ppfVar2,"Note: the following parameters were used: ");
            (anonymous_namespace)::InvariantOuterEdgeCase::Program::description_abi_cxx11_
                      (&local_5b8,pPVar17);
            std::operator<<((ostream *)ppfVar2,(string *)&local_5b8);
            std::operator<<((ostream *)ppfVar2,", tessellation levels: ");
            (anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                      (&local_578,this_00,outerLevels,(float *)outer);
            std::operator<<((ostream *)ppfVar2,(string *)&local_578);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&patchTessLevels,
                       (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_578);
            std::__cxx11::string::~string((string *)&local_5b8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppfVar2);
            std::__cxx11::string::~string((string *)&local_598);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330.m_str);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Invalid set of vertices");
LAB_00416d77:
            bVar5 = false;
            iVar7 = local_6ec;
          }
          std::
          set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
          ::~set(&outerEdgeVertices);
          lVar12 = lVar12 + 1;
          local_6ec = iVar7;
          if (!bVar5) goto LAB_00416f20;
        }
        std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
        ~_Vector_base(&tfResult.varying.
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     );
        lVar19 = lVar19 + 1;
      }
      std::
      set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
      ::~set(&firstOuterEdgeVertices);
      std::__cxx11::string::~string((string *)&bindings[0].binding.name);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>);
      lVar14 = lVar14 + 1;
      uVar15 = extraout_RDX_00;
      if (lVar19 < lVar13) {
        TransformFeedbackHandler<tcu::Vector<float,_3>_>::~TransformFeedbackHandler(&tfHandler);
        goto LAB_00416f96;
      }
    }
    lVar20 = lVar20 + 1;
  } while( true );
}

Assistant:

InvariantOuterEdgeCase::IterateResult InvariantOuterEdgeCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&							log							= m_testCtx.getLog();
	const RenderContext&				renderCtx					= m_context.getRenderContext();
	const RandomViewport				viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&				gl							= renderCtx.getFunctions();

	static const float					singleOuterEdgeLevels[]		= { 1.0f, 1.2f, 1.9f, 2.3f, 2.8f, 3.3f, 3.8f, 10.2f, 1.6f, 24.4f, 24.7f, 63.0f };
	const int							numPatchesPerDrawCall		= 10;
	const vector<OuterEdgeDescription>	edgeDescriptions			= outerEdgeDescriptions(m_primitiveType);

	{
		// Compute the number vertices in the largest draw call, so we can allocate the TF buffer just once.
		int maxNumVerticesInDrawCall = 0;
		{
			const vector<float> patchTessLevels = generatePatchTessLevels(numPatchesPerDrawCall, 0 /* outer-edge index doesn't affect vertex count */, arrayMax(singleOuterEdgeLevels));

			for (int usePointModeI = 0; usePointModeI <= 1; usePointModeI++)
				maxNumVerticesInDrawCall = de::max(maxNumVerticesInDrawCall,
												   multiplePatchReferenceVertexCount(m_primitiveType, m_spacing, usePointModeI != 0, &patchTessLevels[0], numPatchesPerDrawCall));
		}

		{
			const TFHandler tfHandler(m_context.getRenderContext(), maxNumVerticesInDrawCall);

			setViewport(gl, viewport);
			gl.patchParameteri(GL_PATCH_VERTICES, 6);

			for (int outerEdgeIndex = 0; outerEdgeIndex < (int)edgeDescriptions.size(); outerEdgeIndex++)
			{
				const OuterEdgeDescription& edgeDesc = edgeDescriptions[outerEdgeIndex];

				for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(singleOuterEdgeLevels); outerEdgeLevelCaseNdx++)
				{
					typedef std::set<Vec3, VecLexLessThan<3> > Vec3Set;

					const vector<float>				patchTessLevels		= generatePatchTessLevels(numPatchesPerDrawCall, outerEdgeIndex, singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);
					const glu::VertexArrayBinding	bindings[]			= { glu::va::Float("in_v_attr", 1, (int)patchTessLevels.size(), 0, &patchTessLevels[0]) };
					Vec3Set							firstOuterEdgeVertices; // Vertices of the outer edge of the first patch of the first program's draw call; used for comparison with other patches.

					log << TestLog::Message << "Testing with outer tessellation level " << singleOuterEdgeLevels[outerEdgeLevelCaseNdx]
											<< " for the " << edgeDesc.description() << " edge, and with various levels for other edges, and with all programs" << TestLog::EndMessage;

					for (int programNdx = 0; programNdx < (int)m_programs.size(); programNdx++)
					{
						const Program& program		= m_programs[programNdx];
						const deUint32 programGL	= program.program->getProgram();

						gl.useProgram(programGL);

						{
							const TFHandler::Result		tfResult			= tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, program.usePointMode),
																											   DE_LENGTH_OF_ARRAY(bindings), &bindings[0], (int)patchTessLevels.size());
							const int					refNumVertices		= multiplePatchReferenceVertexCount(m_primitiveType, m_spacing, program.usePointMode, &patchTessLevels[0], numPatchesPerDrawCall);
							int							numVerticesRead		= 0;

							if ((int)tfResult.varying.size() != refNumVertices)
							{
								log << TestLog::Message << "Failure: the number of vertices returned by transform feedback is "
														<< tfResult.varying.size() << ", expected " << refNumVertices << TestLog::EndMessage
									<< TestLog::Message << "Note: rendered " << numPatchesPerDrawCall
														<< " patches in one draw call; tessellation levels for each patch are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
														<< containerStr(patchTessLevels, 6) << TestLog::EndMessage;

								m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
								return STOP;
							}

							// Check the vertices of each patch.

							for (int patchNdx = 0; patchNdx < numPatchesPerDrawCall; patchNdx++)
							{
								const float* const	innerLevels			= &patchTessLevels[6*patchNdx + 0];
								const float* const	outerLevels			= &patchTessLevels[6*patchNdx + 2];
								const int			patchNumVertices	= referenceVertexCount(m_primitiveType, m_spacing, program.usePointMode, innerLevels, outerLevels);
								Vec3Set				outerEdgeVertices;

								// We're interested in just the vertices on the current outer edge.
								for(int vtxNdx = numVerticesRead; vtxNdx < numVerticesRead + patchNumVertices; vtxNdx++)
								{
									const Vec3& vtx = tfResult.varying[vtxNdx];
									if (edgeDesc.contains(vtx))
										outerEdgeVertices.insert(tfResult.varying[vtxNdx]);
								}

								// Check that the outer edge contains an appropriate number of vertices.
								{
									const int refNumVerticesOnOuterEdge = 1 + getClampedRoundedTessLevel(m_spacing, singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);

									if ((int)outerEdgeVertices.size() != refNumVerticesOnOuterEdge)
									{
										log << TestLog::Message << "Failure: the number of vertices on outer edge is " << outerEdgeVertices.size()
																<< ", expected " << refNumVerticesOnOuterEdge << TestLog::EndMessage
											<< TestLog::Message << "Note: vertices on the outer edge are:\n" << containerStr(outerEdgeVertices, 5, 0) << TestLog::EndMessage
											<< TestLog::Message << "Note: the following parameters were used: " << program.description()
																<< ", tessellation levels: " << tessellationLevelsString(innerLevels, outerLevels) << TestLog::EndMessage;
										m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
										return STOP;
									}
								}

								// Compare the vertices to those of the first patch (unless this is the first patch).

								if (programNdx == 0 && patchNdx == 0)
									firstOuterEdgeVertices = outerEdgeVertices;
								else
								{
									if (firstOuterEdgeVertices != outerEdgeVertices)
									{
										log << TestLog::Message << "Failure: vertices generated for the edge differ between the following cases:\n"
																<< "  - case A: " << m_programs[0].description() << ", tessellation levels: "
																				  << tessellationLevelsString(&patchTessLevels[0], &patchTessLevels[2]) << "\n"
																<< "  - case B: " << program.description() << ", tessellation levels: "
																				  << tessellationLevelsString(innerLevels, outerLevels) << TestLog::EndMessage;

										log << TestLog::Message << "Note: resulting vertices for the edge for the cases were:\n"
																<< "  - case A: " << containerStr(firstOuterEdgeVertices, 5, 14) << "\n"
																<< "  - case B: " << containerStr(outerEdgeVertices, 5, 14) << TestLog::EndMessage;

										m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
										return STOP;
									}
								}

								numVerticesRead += patchNumVertices;
							}

							DE_ASSERT(numVerticesRead == (int)tfResult.varying.size());
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}